

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O0

int w_print(FILE *stream,char *msg)

{
  int iVar1;
  int *piVar2;
  char *msg_local;
  FILE *stream_local;
  
  if (stream == (FILE *)0x0) {
    w_abort(-1);
  }
  if (msg == (char *)0x0) {
    w_abort(-1);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = fputs(msg,(FILE *)stream);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    stream_local._4_4_ = wp_platform_enforce_error(*piVar2);
  }
  else {
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
w_print(
    FILE *stream,
    const char *msg
)
{
    WP_PLATFORM_ASSERT(stream != NULL);
    WP_PLATFORM_ASSERT(msg != NULL);

    errno = 0;
    if (fputs(msg, stream) == EOF)
    {
        return wp_platform_enforce_error(errno);
    }

    return 0;
}